

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O2

int Curl_socketpair(int domain,int type,int protocol,curl_socket_t *socks)

{
  curl_socket_t __fd;
  int iVar1;
  curl_socklen_t addrlen;
  undefined1 local_44 [8];
  char local_3c [8];
  int reuse;
  anon_union_16_2_022c54a6 a2;
  pollfd pfd [1];
  
  addrlen = 0x10;
  reuse = 1;
  __fd = socket(2,1,6);
  if (__fd == -1) {
    return -1;
  }
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  local_3c[4] = '\0';
  local_3c[5] = '\0';
  local_3c[6] = '\0';
  local_3c[7] = '\0';
  local_44._0_2_ = 2;
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_44[4] = '\x7f';
  local_44[5] = '\0';
  local_44[6] = '\0';
  local_44[7] = '\x01';
  socks[0] = -1;
  socks[1] = -1;
  iVar1 = setsockopt(__fd,1,2,&reuse,4);
  if ((((iVar1 != -1) && (iVar1 = bind(__fd,(sockaddr *)local_44,0x10), iVar1 != -1)) &&
      (iVar1 = getsockname(__fd,(sockaddr *)local_44,&addrlen), iVar1 != -1)) &&
     ((0xf < addrlen && (iVar1 = listen(__fd,1), iVar1 != -1)))) {
    iVar1 = socket(2,1,0);
    *socks = iVar1;
    if ((iVar1 != -1) &&
       ((iVar1 = connect(iVar1,(sockaddr *)local_44,0x10), iVar1 != -1 &&
        (iVar1 = curlx_nonblock(__fd,1), -1 < iVar1)))) {
      pfd[0].events = 1;
      pfd[0].revents = 0;
      pfd[0].fd = __fd;
      Curl_poll(pfd,1,10000);
      iVar1 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
      socks[1] = iVar1;
      if (iVar1 != -1) {
        addrlen = 0x10;
        iVar1 = getsockname(*socks,(sockaddr *)local_44,&addrlen);
        if ((iVar1 != -1) && (0xf < addrlen)) {
          addrlen = 0x10;
          iVar1 = getpeername(socks[1],(sockaddr *)&a2.inaddr,&addrlen);
          if ((iVar1 != -1) &&
             (((0xf < addrlen && (local_44._0_2_ == a2.inaddr.sin_family)) &&
              ((in_addr)local_44._4_4_ == a2.inaddr.sin_addr.s_addr)))) {
            iVar1 = 0;
            if (local_44._2_2_ == a2.inaddr.sin_port) goto LAB_0013d70b;
          }
        }
      }
    }
  }
  close(__fd);
  close(*socks);
  __fd = socks[1];
  iVar1 = -1;
LAB_0013d70b:
  close(__fd);
  return iVar1;
}

Assistant:

int Curl_socketpair(int domain, int type, int protocol,
                    curl_socket_t socks[2])
{
  union {
    struct sockaddr_in inaddr;
    struct sockaddr addr;
  } a, a2;
  curl_socket_t listener;
  curl_socklen_t addrlen = sizeof(a.inaddr);
  int reuse = 1;
  struct pollfd pfd[1];
  (void)domain;
  (void)type;
  (void)protocol;

  listener = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  if(listener == CURL_SOCKET_BAD)
    return -1;

  memset(&a, 0, sizeof(a));
  a.inaddr.sin_family = AF_INET;
  a.inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  a.inaddr.sin_port = 0;

  socks[0] = socks[1] = CURL_SOCKET_BAD;

  if(setsockopt(listener, SOL_SOCKET, SO_REUSEADDR,
                (char *)&reuse, (curl_socklen_t)sizeof(reuse)) == -1)
    goto error;
  if(bind(listener, &a.addr, sizeof(a.inaddr)) == -1)
    goto error;
  if(getsockname(listener, &a.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a.inaddr))
    goto error;
  if(listen(listener, 1) == -1)
    goto error;
  socks[0] = socket(AF_INET, SOCK_STREAM, 0);
  if(socks[0] == CURL_SOCKET_BAD)
    goto error;
  if(connect(socks[0], &a.addr, sizeof(a.inaddr)) == -1)
    goto error;

  /* use non-blocking accept to make sure we don't block forever */
  if(curlx_nonblock(listener, TRUE) < 0)
    goto error;
  pfd[0].fd = listener;
  pfd[0].events = POLLIN;
  pfd[0].revents = 0;
  (void)Curl_poll(pfd, 1, 10*1000); /* 10 seconds */
  socks[1] = accept(listener, NULL, NULL);
  if(socks[1] == CURL_SOCKET_BAD)
    goto error;

  /* verify that nothing else connected */
  addrlen = sizeof(a.inaddr);
  if(getsockname(socks[0], &a.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a.inaddr))
    goto error;
  addrlen = sizeof(a2.inaddr);
  if(getpeername(socks[1], &a2.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a2.inaddr))
    goto error;
  if(a.inaddr.sin_family != a2.inaddr.sin_family ||
     a.inaddr.sin_addr.s_addr != a2.inaddr.sin_addr.s_addr ||
     a.inaddr.sin_port != a2.inaddr.sin_port)
    goto error;

  sclose(listener);
  return 0;

  error:
  sclose(listener);
  sclose(socks[0]);
  sclose(socks[1]);
  return -1;
}